

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRep * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::SubTree(CordRepBtree *this,size_t offset,size_t n)

{
  CordRep *rep;
  int iVar1;
  ulong uVar2;
  ulong end;
  CordRepBtree *pCVar3;
  CordRepBtree *rep_00;
  CordRep *pCVar4;
  int iVar5;
  uint8_t uVar6;
  int iVar7;
  long lVar8;
  uint height;
  Position PVar9;
  CopyResult CVar10;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> SVar11;
  CordRepBtree *local_48;
  
  uVar2 = (this->super_CordRep).length;
  if (uVar2 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x38a,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (uVar2 - n < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x38b,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (n == 0) {
    pCVar3 = (CordRepBtree *)0x0;
  }
  else {
    height = (uint)(this->super_CordRep).storage[0];
    while( true ) {
      PVar9 = IndexOf(this,offset);
      offset = PVar9.n;
      uVar2 = PVar9.index;
      pCVar4 = this->edges_[uVar2];
      if (pCVar4->length < offset + n) break;
      if ((int)height < 1) {
        LOCK();
        (pCVar4->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar4->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar4 = anon_unknown_0::MakeSubstring(pCVar4,offset,n);
        return pCVar4;
      }
      height = height - 1;
      this = CordRep::btree(pCVar4);
    }
    PVar9 = IndexBefore(this,PVar9,n);
    end = PVar9.index;
    if (end <= uVar2) {
      __assert_fail("back.index > front.index",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x39b,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
    }
    rep = this->edges_[end];
    if (height == 0) {
      LOCK();
      (pCVar4->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar4->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      rep_00 = (CordRepBtree *)anon_unknown_0::MakeSubstring(pCVar4,offset);
      pCVar4 = CordRep::Ref(rep);
      height = 0;
      local_48 = (CordRepBtree *)anon_unknown_0::MakeSubstring(pCVar4,0,PVar9.n);
    }
    else {
      pCVar3 = CordRep::btree(pCVar4);
      CVar10 = CopySuffix(pCVar3,offset);
      rep_00 = (CordRepBtree *)CVar10.edge;
      iVar7 = CVar10.height;
      pCVar3 = CordRep::btree(rep);
      CVar10 = CopyPrefix(pCVar3,PVar9.n,true);
      local_48 = (CordRepBtree *)CVar10.edge;
      iVar5 = CVar10.height;
      iVar1 = iVar5;
      if (iVar5 < iVar7) {
        iVar1 = iVar7;
      }
      if (uVar2 + 1 == end) {
        height = iVar1 + 1;
      }
      while (iVar7 = iVar7 + 1, iVar7 < (int)height) {
        rep_00 = New(&rep_00->super_CordRep);
      }
      while (iVar5 = iVar5 + 1, iVar5 < (int)height) {
        local_48 = New(&local_48->super_CordRep);
      }
    }
    pCVar3 = New(height);
    pCVar3->edges_[0] = &rep_00->super_CordRep;
    SVar11 = Edges(this,uVar2 + 1,end);
    uVar6 = '\x02';
    for (lVar8 = 0; SVar11.len_ << 3 != lVar8; lVar8 = lVar8 + 8) {
      pCVar4 = CordRep::Ref(*(CordRep **)((long)SVar11.ptr_ + lVar8));
      *(CordRep **)((long)pCVar3->edges_ + lVar8 + 8) = pCVar4;
      uVar6 = uVar6 + '\x01';
    }
    *(CordRepBtree **)((long)pCVar3->edges_ + lVar8 + 8) = local_48;
    (pCVar3->super_CordRep).storage[2] = uVar6;
    (pCVar3->super_CordRep).length = n;
    AssertValid(pCVar3,true);
  }
  return &pCVar3->super_CordRep;
}

Assistant:

CordRep* CordRepBtree::SubTree(size_t offset, size_t n) {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return nullptr;

  CordRepBtree* node = this;
  int height = node->height();
  Position front = node->IndexOf(offset);
  CordRep* left = node->edges_[front.index];
  while (front.n + n <= left->length) {
    if (--height < 0) return MakeSubstring(CordRep::Ref(left), front.n, n);
    node = left->btree();
    front = node->IndexOf(front.n);
    left = node->edges_[front.index];
  }

  const Position back = node->IndexBefore(front, n);
  CordRep* const right = node->edges_[back.index];
  assert(back.index > front.index);

  // Get partial suffix and prefix entries.
  CopyResult prefix;
  CopyResult suffix;
  if (height > 0) {
    // Copy prefix and suffix of the boundary nodes.
    prefix = left->btree()->CopySuffix(front.n);
    suffix = right->btree()->CopyPrefix(back.n);

    // If there is an edge between the prefix and suffix edges, then the tree
    // must remain at its previous (full) height. If we have no edges between
    // prefix and suffix edges, then the tree must be as high as either the
    // suffix or prefix edges (which are collapsed to their minimum heights).
    if (front.index + 1 == back.index) {
      height = (std::max)(prefix.height, suffix.height) + 1;
    }

    // Raise prefix and suffixes to the new tree height.
    for (int h = prefix.height + 1; h < height; ++h) {
      prefix.edge = CordRepBtree::New(prefix.edge);
    }
    for (int h = suffix.height + 1; h < height; ++h) {
      suffix.edge = CordRepBtree::New(suffix.edge);
    }
  } else {
    // Leaf node, simply take substrings for prefix and suffix.
    prefix = CopyResult{MakeSubstring(CordRep::Ref(left), front.n), -1};
    suffix = CopyResult{MakeSubstring(CordRep::Ref(right), 0, back.n), -1};
  }

  // Compose resulting tree.
  CordRepBtree* sub = CordRepBtree::New(height);
  size_t end = 0;
  sub->edges_[end++] = prefix.edge;
  for (CordRep* r : node->Edges(front.index + 1, back.index)) {
    sub->edges_[end++] = CordRep::Ref(r);
  }
  sub->edges_[end++] = suffix.edge;
  sub->set_end(end);
  sub->length = n;
  return AssertValid(sub);
}